

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O0

void __thiscall
compiler::CompilerAstWalker::onExitDeclareStatementAstNode
          (CompilerAstWalker *this,DeclareStatementAstNode *node)

{
  bool mustBeTrue;
  element_type *peVar1;
  element_type *var;
  allocator<char> local_49;
  string local_48;
  undefined1 local_21;
  size_t sStack_20;
  bool find;
  size_t index;
  DeclareStatementAstNode *node_local;
  CompilerAstWalker *this_local;
  
  sStack_20 = 0;
  index = (size_t)node;
  node_local = (DeclareStatementAstNode *)this;
  peVar1 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  var = std::__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<Token,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   (index + 8));
  mustBeTrue = EmissionContext::GetDeclarationIndex
                         (peVar1,&var->value,&stack0xffffffffffffffe0,true);
  local_21 = mustBeTrue;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Could not find local declaration for declare statement",&local_49)
  ;
  Error::assertWithPanic(mustBeTrue,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  peVar1 = std::
           __shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->ec);
  EmissionContext::FullyBind(peVar1,sStack_20);
  emit(this,SetLocal,sStack_20);
  return;
}

Assistant:

void onExitDeclareStatementAstNode(DeclareStatementAstNode* node) noexcept override {
    std::size_t index = 0;
    bool find = this->ec->GetDeclarationIndex(node->identifier->value, index, true);
    Error::assertWithPanic(find, "Could not find local declaration for declare statement");
    this->ec->FullyBind(index);
    this->emit(bytecode::ByteCodeInstruction::SetLocal, index);
  }